

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_utils.c
# Opt level: O2

asterism_str asterism_strstrip(asterism_str s)

{
  char *pcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  asterism_str aVar7;
  
  pcVar6 = s.p;
  pcVar1 = pcVar6 + s.len;
  sVar4 = s.len;
  while ((pcVar3 = pcVar1, sVar4 != 0 &&
         (ppuVar2 = __ctype_b_loc(), pcVar3 = pcVar6,
         (*(byte *)((long)*ppuVar2 + (long)*pcVar6 * 2 + 1) & 0x20) != 0))) {
    pcVar6 = pcVar6 + 1;
    sVar4 = sVar4 - 1;
  }
  do {
    sVar5 = sVar4;
    if (sVar5 == 0) break;
    ppuVar2 = __ctype_b_loc();
    sVar4 = sVar5 - 1;
  } while ((*(byte *)((long)*ppuVar2 + (long)pcVar3[sVar5 - 1] * 2 + 1) & 0x20) != 0);
  aVar7.len = sVar5;
  aVar7.p = pcVar3;
  return aVar7;
}

Assistant:

struct asterism_str asterism_strstrip(struct asterism_str s)
{
    while (s.len > 0 && isspace((int)*s.p))
    {
        s.p++;
        s.len--;
    }
    while (s.len > 0 && isspace((int)*(s.p + s.len - 1)))
    {
        s.len--;
    }
    return s;
}